

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O1

bool __thiscall jbcoin::STObject::operator==(STObject *this,STObject *obj)

{
  int iVar1;
  pointer pSVar2;
  pointer pSVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  STVar *t2;
  pointer pSVar7;
  pointer pSVar8;
  byte bVar9;
  uint uVar10;
  STVar *t1;
  bool bVar11;
  bool bVar12;
  uint local_44;
  
  pSVar8 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  bVar11 = pSVar8 == pSVar2;
  if (bVar11) {
    local_44 = 0;
  }
  else {
    local_44 = 0;
    do {
      iVar4 = (*pSVar8->p_->_vptr_STBase[4])();
      bVar12 = true;
      if ((iVar4 != 0) && (pSVar8->p_->fName->fieldValue < 0x100)) {
        pSVar7 = (obj->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar3 = (obj->v_).
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar7 == pSVar3) {
          bVar6 = 4;
          bVar9 = 1;
        }
        else {
          bVar9 = 0;
          do {
            iVar4 = pSVar8->p_->fName->fieldCode;
            iVar1 = pSVar7->p_->fName->fieldCode;
            if (iVar4 == iVar1) {
              iVar5 = (*pSVar7->p_->_vptr_STBase[9])();
              bVar6 = 1;
              if ((char)iVar5 != '\0') {
                local_44 = local_44 + 1;
                bVar6 = 4;
                bVar9 = 1;
              }
            }
            else {
              bVar6 = 0;
            }
            if (iVar4 == iVar1) goto LAB_001b69a7;
            pSVar7 = pSVar7 + 1;
          } while (pSVar7 != pSVar3);
          bVar6 = 4;
LAB_001b69a7:
          bVar9 = ~bVar9 & 1;
        }
        if (bVar6 != 4) {
          bVar9 = bVar6;
        }
        bVar12 = bVar9 == 0;
      }
      if (!bVar12) break;
      pSVar8 = pSVar8 + 1;
      bVar11 = pSVar8 == pSVar2;
    } while (!bVar11);
  }
  uVar10 = 0;
  if (bVar11) {
    pSVar8 = (obj->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = (obj->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pSVar8 != pSVar2) {
      uVar10 = 0;
      do {
        iVar4 = (*pSVar8->p_->_vptr_STBase[4])();
        if (iVar4 != 0) {
          uVar10 = uVar10 + (pSVar8->p_->fName->fieldValue < 0x100);
        }
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar2);
    }
    uVar10 = (uint)(uVar10 == local_44);
  }
  return SUB41(uVar10,0);
}

Assistant:

bool STObject::operator== (const STObject& obj) const
{
    // This is not particularly efficient, and only compares data elements
    // with binary representations
    int matches = 0;
    for (auto const& t1 : v_)
    {
        if ((t1->getSType () != STI_NOTPRESENT) && t1->getFName ().isBinary ())
        {
            // each present field must have a matching field
            bool match = false;
            for (auto const& t2 : obj.v_)
            {
                if (t1->getFName () == t2->getFName ())
                {
                    if (t2 != t1)
                        return false;

                    match = true;
                    ++matches;
                    break;
                }
            }

            if (!match)
                return false;
        }
    }

    int fields = 0;
    for (auto const& t2 : obj.v_)
    {
        if ((t2->getSType () != STI_NOTPRESENT) && t2->getFName ().isBinary ())
            ++fields;
    }

    if (fields != matches)
        return false;

    return true;
}